

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O0

void __thiscall
icu_63::Normalizer2DataBuilder::setRoundTripMapping
          (Normalizer2DataBuilder *this,UChar32 c,UnicodeString *m)

{
  UBool UVar1;
  int32_t length;
  uint uVar2;
  char16_t *p_00;
  UChar *s;
  Norm *p_01;
  Norm *pNVar3;
  UnicodeString *this_00;
  UnicodeString *local_68;
  Norm *p;
  int32_t numCP;
  UnicodeString *m_local;
  UChar32 c_local;
  Normalizer2DataBuilder *this_local;
  
  if ((c & 0xfffff800U) == 0xd800) {
    fprintf(_stderr,
            "error in gennorm2 phase %d: illegal round-trip mapping from surrogate code point U+%04lX\n"
            ,(ulong)(uint)this->phase,(long)c);
    exit(3);
  }
  UVar1 = isWellFormed(m);
  if (UVar1 == '\0') {
    fprintf(_stderr,
            "error in gennorm2 phase %d: illegal round-trip mapping from U+%04lX to malformed string\n"
            ,(ulong)(uint)this->phase,(long)c);
    exit(3);
  }
  p_00 = UnicodeString::getBuffer(m);
  s = toUCharPtr(p_00);
  length = UnicodeString::length(m);
  uVar2 = u_countChar32_63(s,length);
  if (uVar2 != 2) {
    fprintf(_stderr,
            "error in gennorm2 phase %d: illegal round-trip mapping from U+%04lX to %d!=2 code points\n"
            ,(ulong)(uint)this->phase,(long)c,(ulong)uVar2);
    exit(3);
  }
  p_01 = Norms::createNorm(&this->norms,c);
  pNVar3 = checkNormForMapping(this,p_01,c);
  this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)p_01);
  local_68 = (UnicodeString *)0x0;
  if (this_00 != (UnicodeString *)0x0) {
    UnicodeString::UnicodeString(this_00,m);
    local_68 = this_00;
  }
  pNVar3->mapping = local_68;
  pNVar3->mappingType = ROUND_TRIP;
  pNVar3->mappingCP = -1;
  UnicodeSet::add(&(this->norms).mappingSet,c);
  return;
}

Assistant:

void Normalizer2DataBuilder::setRoundTripMapping(UChar32 c, const UnicodeString &m) {
    if(U_IS_SURROGATE(c)) {
        fprintf(stderr,
                "error in gennorm2 phase %d: "
                "illegal round-trip mapping from surrogate code point U+%04lX\n",
                (int)phase, (long)c);
        exit(U_INVALID_FORMAT_ERROR);
    }
    if(!isWellFormed(m)) {
        fprintf(stderr,
                "error in gennorm2 phase %d: "
                "illegal round-trip mapping from U+%04lX to malformed string\n",
                (int)phase, (long)c);
        exit(U_INVALID_FORMAT_ERROR);
    }
    int32_t numCP=u_countChar32(toUCharPtr(m.getBuffer()), m.length());
    if(numCP!=2) {
        fprintf(stderr,
                "error in gennorm2 phase %d: "
                "illegal round-trip mapping from U+%04lX to %d!=2 code points\n",
                (int)phase, (long)c, (int)numCP);
        exit(U_INVALID_FORMAT_ERROR);
    }
    Norm *p=checkNormForMapping(norms.createNorm(c), c);
    p->mapping=new UnicodeString(m);
    p->mappingType=Norm::ROUND_TRIP;
    p->mappingCP=U_SENTINEL;
    norms.mappingSet.add(c);
}